

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int disposition_set_batchable(DISPOSITION_HANDLE disposition,_Bool batchable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE batchable_amqp_value;
  DISPOSITION_INSTANCE *disposition_instance;
  int result;
  _Bool batchable_value_local;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._0_4_ = 0x2360;
  }
  else {
    item_value = amqpvalue_create_boolean(batchable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      disposition_instance._0_4_ = 0x2368;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(disposition->composite_value,5,item_value);
      if (iVar1 == 0) {
        disposition_instance._0_4_ = 0;
      }
      else {
        disposition_instance._0_4_ = 0x236e;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)disposition_instance;
}

Assistant:

int disposition_set_batchable(DISPOSITION_HANDLE disposition, bool batchable_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        AMQP_VALUE batchable_amqp_value = amqpvalue_create_boolean(batchable_value);
        if (batchable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(disposition_instance->composite_value, 5, batchable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(batchable_amqp_value);
        }
    }

    return result;
}